

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2C02.h
# Opt level: O0

Sprite * __thiscall m2C02::GetPatternTable(m2C02 *this,uint8_t i,uint8_t palette)

{
  byte bVar1;
  short sVar2;
  reference pvVar3;
  anon_union_4_2_12391da5_for_Pixel_0 *paVar4;
  byte bVar5;
  ushort local_1e;
  byte local_1c;
  byte local_1b;
  ushort local_1a;
  uint8_t pixel;
  uint16_t col;
  uint8_t tileMsb;
  uint8_t tileLsb;
  uint16_t row;
  uint16_t nOffset;
  uint16_t nTileX;
  uint16_t nTileY;
  uint8_t palette_local;
  uint8_t i_local;
  m2C02 *this_local;
  
  for (_tileMsb = 0; _tileMsb < 0x10; _tileMsb = _tileMsb + 1) {
    for (col = 0; col < 0x10; col = col + 1) {
      sVar2 = _tileMsb * 0x100 + col * 0x10;
      for (local_1a = 0; local_1a < 8; local_1a = local_1a + 1) {
        local_1b = ppuRead(this,(ushort)i * 0x1000 + sVar2 + local_1a,false);
        local_1c = ppuRead(this,(ushort)i * 0x1000 + sVar2 + local_1a + 8,false);
        for (local_1e = 0; local_1e < 8; local_1e = local_1e + 1) {
          bVar1 = local_1b & 1;
          bVar5 = local_1c & 1;
          local_1b = (byte)((int)(uint)local_1b >> 1);
          local_1c = (byte)((int)(uint)local_1c >> 1);
          pvVar3 = std::array<olc::Sprite,_2UL>::operator[](&this->sprPatternTable,(ulong)i);
          paVar4 = &GetColourFromPaletteRam(this,palette,bVar1 + bVar5)->field_0;
          olc::Sprite::SetPixel
                    (pvVar3,(uint)col * 8 + (7 - (uint)local_1e),(uint)_tileMsb * 8 + (uint)local_1a
                     ,(Pixel)paVar4->field_1);
        }
      }
    }
  }
  pvVar3 = std::array<olc::Sprite,_2UL>::operator[](&this->sprPatternTable,(ulong)i);
  return pvVar3;
}

Assistant:

olc::Sprite &GetPatternTable(uint8_t i, uint8_t palette)
  {
    for (uint16_t nTileY = 0; nTileY < 16; nTileY++)
    {
      for (uint16_t nTileX = 0; nTileX < 16; nTileX++)
      {
        uint16_t nOffset = nTileY * 256 + nTileX * 16;

        for (uint16_t row = 0; row < 8; row++)
        {
          uint8_t tileLsb = ppuRead(i * 0x1000u + nOffset + row + 0);
          uint8_t tileMsb = ppuRead(i * 0x1000u + nOffset + row + 8);

          for (uint16_t col = 0; col < 8; col++)
          {
            uint8_t pixel = (tileLsb & 0x01u) + (tileMsb & 0x01u);
            tileLsb >>= 1;
            tileMsb >>= 1;
            sprPatternTable[i].SetPixel(
                nTileX * 8 + (7 - col), nTileY * 8 + row,
                GetColourFromPaletteRam(palette, pixel));
          }
        }
      }
    }

    return sprPatternTable[i];
  }